

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O1

pboolean p_socket_set_buffer_size(PSocket *socket,PSocketDirection dir,psize size,PError **error)

{
  int iVar1;
  pint optval;
  undefined1 local_14 [4];
  
  if (socket == (PSocket *)0x0) {
    p_socket_set_buffer_size_cold_3();
  }
  else if ((socket->field_0x18 & 4) == 0) {
    iVar1 = setsockopt(socket->fd,1,(dir == P_SOCKET_DIRECTION_RCV) + 7,local_14,4);
    if (iVar1 == 0) {
      return 1;
    }
    p_socket_set_buffer_size_cold_2();
  }
  else {
    p_socket_set_buffer_size_cold_1();
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_socket_set_buffer_size (const PSocket		*socket,
			  PSocketDirection	dir,
			  psize			size,
			  PError		**error)
{
	pint	optname;
	pint	optval;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	optname = (dir == P_SOCKET_DIRECTION_RCV) ? SO_RCVBUF : SO_SNDBUF;
	optval  = (pint) size;

	if (P_UNLIKELY (setsockopt (socket->fd,
				    SOL_SOCKET,
				    optname,
				    (pconstpointer) &optval,
				    sizeof (optval)) != 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call setsockopt() on socket to set buffer size");
		return FALSE;
	}

	return TRUE;
}